

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httplib.h
# Opt level: O3

ssize_t __thiscall
httplib::SocketStream::read(SocketStream *this,int __fd,void *__buf,size_t __nbytes)

{
  int iVar1;
  int iVar2;
  ssize_t sVar3;
  undefined4 in_register_00000034;
  fd_set fds;
  timeval local_a8;
  fd_set local_98;
  
  iVar2 = this->sock_;
  local_98.fds_bits[0xe] = 0;
  local_98.fds_bits[0xf] = 0;
  local_98.fds_bits[0xc] = 0;
  local_98.fds_bits[0xd] = 0;
  local_98.fds_bits[10] = 0;
  local_98.fds_bits[0xb] = 0;
  local_98.fds_bits[8] = 0;
  local_98.fds_bits[9] = 0;
  local_98.fds_bits[6] = 0;
  local_98.fds_bits[7] = 0;
  local_98.fds_bits[4] = 0;
  local_98.fds_bits[5] = 0;
  local_98.fds_bits[2] = 0;
  local_98.fds_bits[3] = 0;
  local_98.fds_bits[0] = 0;
  local_98.fds_bits[1] = 0;
  iVar1 = iVar2 + 0x3f;
  if (-1 < iVar2) {
    iVar1 = iVar2;
  }
  local_98.fds_bits[iVar1 >> 6] =
       local_98.fds_bits[iVar1 >> 6] | 1L << ((byte)(iVar2 % 0x40) & 0x3f);
  local_a8.tv_sec = this->read_timeout_sec_;
  local_a8.tv_usec = this->read_timeout_usec_;
  iVar2 = select(iVar2 + 1,&local_98,(fd_set *)0x0,(fd_set *)0x0,&local_a8);
  if (iVar2 < 1) {
    sVar3 = 0xffffffff;
  }
  else {
    sVar3 = recv(this->sock_,(void *)CONCAT44(in_register_00000034,__fd),(long)(int)__buf,0);
  }
  return sVar3;
}

Assistant:

inline int SocketStream::read(char *ptr, size_t size) {
  if (detail::select_read(sock_, read_timeout_sec_, read_timeout_usec_) > 0) {
    return recv(sock_, ptr, static_cast<int>(size), 0);
  }
  return -1;
}